

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

bool __thiscall QFileSystemModel::event(QFileSystemModel *this,QEvent *event)

{
  long lVar1;
  undefined1 uVar2;
  QAbstractFileIconProvider *iconProvider;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 0x59) {
    lVar1 = *(long *)&this->field_0x8;
    iconProvider = QFileInfoGatherer::iconProvider(*(QFileInfoGatherer **)(lVar1 + 0xe0));
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    QFileSystemModelPrivate::QFileSystemNode::retranslateStrings
              ((QFileSystemNode *)(lVar1 + 0x138),iconProvider,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    uVar2 = QObject::event((QEvent *)this);
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::event(QEvent *event)
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(QFileSystemModel);
    if (event->type() == QEvent::LanguageChange) {
        d->root.retranslateStrings(d->fileInfoGatherer->iconProvider(), QString());
        return true;
    }
#endif
    return QAbstractItemModel::event(event);
}